

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool IsValidVertexEdgeLink
               (ON_SubDVertex *vertex,ON_SubDEdge *edge,ON__UINT_PTR end_index,bool bSilentError)

{
  uchar uVar1;
  ON_SubDEdgeTag OVar2;
  bool bVar3;
  byte extraout_AL;
  byte bVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  ON_SubDSectorType st;
  ON_SubDSectorType OStack_48;
  
  if ((((vertex == (ON_SubDVertex *)0x0 || edge == (ON_SubDEdge *)0x0) ||
       (edge->m_vertex[end_index] != vertex)) ||
      (uVar1 = (edge->super_ON_SubDComponentBase).m_level,
      (vertex->super_ON_SubDComponentBase).m_level != uVar1)) ||
     (((dVar7 = edge->m_sector_coefficient[end_index], dVar7 < 0.0 || (1.0 <= dVar7)) &&
      ((uVar1 != '\0' || ((dVar7 != -8883.0 || (NAN(dVar7))))))))) goto LAB_005da1c9;
  OVar2 = edge->m_edge_tag;
  if (OVar2 != SmoothX) {
    if (OVar2 == Crease) {
      if ((((dVar7 == 0.0) && (!NAN(dVar7))) && (vertex->m_vertex_tag != Unset)) &&
         (vertex->m_vertex_tag != Smooth)) goto LAB_005da289;
    }
    else if (OVar2 == Smooth) goto LAB_005da195;
LAB_005da1c9:
    ON_SubDIncrementErrorCount();
    if (!bSilentError) {
      bVar3 = ON_IsNotValid();
      return bVar3;
    }
    bVar4 = 0;
    goto LAB_005da1d4;
  }
LAB_005da195:
  if (vertex->m_vertex_tag == Smooth) {
    if ((dVar7 != 0.0) || (NAN(dVar7))) goto LAB_005da1c9;
  }
  else {
    uVar5 = 3;
    lVar6 = 0;
    do {
      if ((edge->m_vertex[lVar6] != (ON_SubDVertex *)0x0) &&
         ((byte)(edge->m_vertex[lVar6]->m_vertex_tag - Crease) < 3)) {
        bVar3 = uVar5 == 3;
        uVar5 = 2;
        if (bVar3) {
          uVar5 = (uint)lVar6;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 == 1);
    if (OVar2 == SmoothX) {
      if (uVar5 != 2) goto LAB_005da26b;
LAB_005da238:
      ON_SubDSectorType::Create(&OStack_48,edge,(uint)end_index);
      bVar3 = ON_SubDSectorType::IsValid(&OStack_48);
      if (((!bVar3) ||
          (dVar7 = ON_SubDSectorType::SectorCoefficient(&OStack_48),
          dVar7 != edge->m_sector_coefficient[end_index])) || ((dVar7 <= 0.0 || (1.0 <= dVar7))))
      goto LAB_005da26b;
      bVar3 = true;
      bVar4 = extraout_AL;
    }
    else {
      if (uVar5 == (uint)end_index) goto LAB_005da238;
LAB_005da26b:
      ON_SubDIncrementErrorCount();
      if (bSilentError) {
        bVar3 = false;
        bVar4 = 0;
      }
      else {
        bVar3 = false;
        bVar4 = ON_IsNotValid();
      }
    }
    if (!bVar3) goto LAB_005da1d4;
  }
LAB_005da289:
  bVar4 = 1;
LAB_005da1d4:
  return (bool)(bVar4 & 1);
}

Assistant:

static bool IsValidVertexEdgeLink(
  const ON_SubDVertex* vertex,
  const ON_SubDEdge* edge,
  ON__UINT_PTR end_index,
  bool bSilentError
)
{
  if (nullptr == vertex || nullptr == edge)
    return ON_SubDIsNotValid(bSilentError);

  if (end_index > 1)
    return ON_SubDIsNotValid(bSilentError);

  if (edge->m_vertex[end_index] != vertex)
    return ON_SubDIsNotValid(bSilentError);

  if (vertex->SubdivisionLevel() != edge->SubdivisionLevel())
    return ON_SubDIsNotValid(bSilentError);

  if (false == EdgeSectorCoefficientIsValid(edge->m_sector_coefficient[end_index],edge))
    return ON_SubDIsNotValid(bSilentError);

  if ( edge->IsSmooth() )
  {
    // edge->m_edge_tag is ON_SubDEdgeTag::Smooth or ON_SubDEdgeTag::SmoothX
    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
    {
      if (false == (0.0 == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);
    }
    else
    {
      const unsigned int tagged_end_index = edge->TaggedEndIndex();
      if (ON_SubDEdgeTag::SmoothX == edge->m_edge_tag)
      {
        if (2 != tagged_end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
      else
      {
        if (tagged_end_index != (unsigned int)end_index)
          return ON_SubDIsNotValid(bSilentError);
      }
       
      ON_SubDSectorType st = ON_SubDSectorType::Create(edge,(unsigned int)end_index);
      if (!st.IsValid())
        return ON_SubDIsNotValid(bSilentError);

      const double expected_sector_coefficient = st.SectorCoefficient();
      if (false == (expected_sector_coefficient == edge->m_sector_coefficient[end_index]))
        return ON_SubDIsNotValid(bSilentError);

      if (false == EdgeSectorCoefficientIsSet(expected_sector_coefficient))
        return ON_SubDIsNotValid(bSilentError);
    }
  }
  else if(ON_SubDEdgeTag::Crease == edge->m_edge_tag)
  {
    // crease edge
    if (!(0.0 == edge->m_sector_coefficient[end_index]))
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Smooth == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);

    if (ON_SubDVertexTag::Unset == vertex->m_vertex_tag)
      return ON_SubDIsNotValid(bSilentError);
  }
  else
  {
    return ON_SubDIsNotValid(bSilentError);
  }

  return true;
}